

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_GiveInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *__assertion;
  VMReturn *in_R9;
  AActor *receiver;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003e04e3;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e04d3:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e04e3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x97a,
                  "int AF_AActor_A_GiveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  receiver = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (receiver != (AActor *)0x0) {
      bVar1 = DObject::IsKindOf((DObject *)receiver,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003e04e3;
      }
      goto LAB_003e0495;
    }
  }
  else if (receiver != (AActor *)0x0) goto LAB_003e04d3;
  receiver = (AActor *)0x0;
LAB_003e0495:
  iVar2 = 0;
  bVar1 = DoGiveInventory(receiver,false,param,defaultparam,numparam,in_R9,(int)ret);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x97b,
                    "int AF_AActor_A_GiveInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,(uint)bVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(DoGiveInventory(self, false, VM_ARGS_NAMES));
}